

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_DCtx_getParameter(ZSTD_DCtx *dctx,ZSTD_dParameter param,int *value)

{
  uint uVar1;
  uint *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 local_8;
  
  if (in_ESI == 100) {
    uVar1 = ZSTD_highbit32(0);
    *in_RDX = uVar1;
    local_8 = 0;
  }
  else if (in_ESI == 1000) {
    *in_RDX = *(uint *)(in_RDI + 0x7598);
    local_8 = 0;
  }
  else if (in_ESI == 0x3e9) {
    *in_RDX = *(uint *)(in_RDI + 0x7670);
    local_8 = 0;
  }
  else if (in_ESI == 0x3ea) {
    *in_RDX = *(uint *)(in_RDI + 0x759c);
    local_8 = 0;
  }
  else if (in_ESI == 0x3eb) {
    *in_RDX = *(uint *)(in_RDI + 0x7610);
    local_8 = 0;
  }
  else if (in_ESI == 0x3ec) {
    *in_RDX = *(uint *)(in_RDI + 0x7614);
    local_8 = 0;
  }
  else {
    local_8 = 0xffffffffffffffd8;
  }
  return local_8;
}

Assistant:

size_t ZSTD_DCtx_getParameter(ZSTD_DCtx* dctx, ZSTD_dParameter param, int* value)
{
    switch (param) {
        case ZSTD_d_windowLogMax:
            *value = (int)ZSTD_highbit32((U32)dctx->maxWindowSize);
            return 0;
        case ZSTD_d_format:
            *value = (int)dctx->format;
            return 0;
        case ZSTD_d_stableOutBuffer:
            *value = (int)dctx->outBufferMode;
            return 0;
        case ZSTD_d_forceIgnoreChecksum:
            *value = (int)dctx->forceIgnoreChecksum;
            return 0;
        case ZSTD_d_refMultipleDDicts:
            *value = (int)dctx->refMultipleDDicts;
            return 0;
        case ZSTD_d_disableHuffmanAssembly:
            *value = (int)dctx->disableHufAsm;
            return 0;
        default:;
    }
    RETURN_ERROR(parameter_unsupported, "");
}